

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,LambdaCallNode *node)

{
  LambdaNode *pLVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  long *plVar4;
  PrintVisitor visitor;
  string local_60;
  undefined **local_40;
  ostream *local_38;
  int local_30;
  
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_60,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_60);
  std::operator<<(poVar3,"LambdaCallNode:\n");
  std::__cxx11::string::~string((string *)&local_60);
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_60,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_60);
  std::operator<<(poVar3,"Arguments:\n");
  std::__cxx11::string::~string((string *)&local_60);
  local_38 = this->stream_;
  local_30 = this->indentation_ + 1;
  local_40 = &PTR__Visitor_00148d30;
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)CONCAT44(extraout_var,iVar2)) {
    (**(code **)(*(long *)plVar4[2] + 0x10))((long *)plVar4[2],&local_40);
  }
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_60,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_60);
  std::operator<<(poVar3,"Lambda:\n");
  std::__cxx11::string::~string((string *)&local_60);
  pLVar1 = (node->lambda_)._M_t.super___uniq_ptr_impl<LambdaNode,_std::default_delete<LambdaNode>_>.
           _M_t.super__Tuple_impl<0UL,_LambdaNode_*,_std::default_delete<LambdaNode>_>.
           super__Head_base<0UL,_LambdaNode_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pLVar1->super_ExpressionNode).super_Node + 0x10))(pLVar1,&local_40);
  return;
}

Assistant:

void PrintVisitor::visit(const LambdaCallNode& node)
{
  stream_ << indent() << "LambdaCallNode:\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
  stream_ << indent() << "Lambda:\n";
  node.getLambda().accept(visitor);
}